

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_compareStandardUnitsAsCompatible_Test::Units_compareStandardUnitsAsCompatible_Test
          (Units_compareStandardUnitsAsCompatible_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0016cb38;
  return;
}

Assistant:

TEST(Units, compareStandardUnitsAsCompatible)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("u");
    u1->addUnit("u");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("u");
    u2->addUnit("u");

    libcellml::ModelPtr model = libcellml::Model::create();
    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
    EXPECT_TRUE(libcellml::Units::compatible(u2, u1));
}